

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  thread *in_RSI;
  thread t2;
  thread t1;
  EventCount eventCount;
  EventCount **in_stack_ffffffffffffffe0;
  _func_void_EventCount_ptr *in_stack_ffffffffffffffe8;
  
  EventCount::EventCount((EventCount *)0x104b64);
  std::thread::thread<void(&)(EventCount*),EventCount*,void>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  usleep(1);
  std::thread::thread<void(&)(EventCount*),EventCount*,void>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::thread::join();
  std::thread::join();
  std::thread::~thread((thread *)0x104bdc);
  std::thread::~thread((thread *)0x104be6);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    EventCount eventCount;

    std::thread t1(waiter, &eventCount);
    usleep(1);
    std::thread t2(notifier, &eventCount);

    t1.join();
    t2.join();

    return 0;
}